

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cc
# Opt level: O3

Pivot * __thiscall fizplex::Base::find_pivot(Pivot *__return_storage_ptr__,Base *this,size_t ind)

{
  size_t sVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double local_48;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->value = 0.0;
  __return_storage_ptr__->index = 0;
  if (ind < this->m) {
    lVar3 = ind << 5;
    local_48 = 0.0;
    sVar1 = 0;
    bVar2 = false;
    sVar4 = ind;
    do {
      dVar5 = SVector::get_value((SVector *)
                                 ((long)&(((this->etms).
                                           super__Vector_base<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->eta).values +
                                 lVar3),ind);
      if (1e-07 < ABS(dVar5)) {
        if (bVar2) {
          auVar6._8_4_ = SUB84(ABS(local_48),0);
          auVar6._0_8_ = ABS(dVar5);
          auVar6._12_4_ = (int)((ulong)ABS(local_48) >> 0x20);
          auVar6 = divpd(_DAT_0019d6a0,auVar6);
          if (ABS(DAT_0019d6a0._8_8_ - auVar6._8_8_) <= ABS((double)DAT_0019d6a0 - auVar6._0_8_))
          goto LAB_00173188;
        }
        bVar2 = true;
        sVar1 = sVar4;
        local_48 = dVar5;
      }
LAB_00173188:
      sVar4 = sVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (sVar4 < this->m);
    __return_storage_ptr__->value = local_48;
    __return_storage_ptr__->index = sVar1;
  }
  else {
    bVar2 = false;
  }
  __return_storage_ptr__->found = bVar2;
  return __return_storage_ptr__;
}

Assistant:

Base::Pivot Base::find_pivot(size_t ind) const {
  static const auto dist_to_one = [](double d) {
    return std::fabs(1 - 1.0 / std::fabs(d));
  };
  Pivot pivot{false, 0, 0};
  for (size_t j = ind; j < m; j++) { // Find etm with non-zero in ind
    auto val = etms[j].eta.get_value(ind);
    if (is_zero(val))
      continue;
    if (not pivot.found or (dist_to_one(val) < dist_to_one(pivot.value))) {
      pivot.found = true;
      pivot.index = j;
      pivot.value = val;
    }
  }
  return pivot;
}